

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# koch_snowflake.c
# Opt level: O2

int main(int argc,char **argv)

{
  ulong uVar1;
  float fVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  int i;
  int iVar8;
  int iVar9;
  bov_window_t *window;
  long lVar10;
  GLfloat (*coords) [2];
  GLuint *elements;
  bov_points_t *pointset;
  bov_order_t *order;
  bov_text_t *text;
  GLfloat (*in_RCX) [2];
  ulong uVar11;
  ulong uVar12;
  int i_1;
  undefined8 in_R8;
  double dVar13;
  float s;
  float fVar14;
  float fVar16;
  GLfloat aGVar15 [2];
  GLfloat local_94;
  undefined8 local_70;
  GLfloat local_68 [4];
  GLubyte local_58 [40];
  
  window = bov_window_new(0x400,0x280,*argv);
  local_68[0] = 0.3;
  local_68[1] = 0.3;
  local_68[2] = 0.3;
  local_68[3] = 1.0;
  for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
    window->backgroundColor[lVar10] = local_68[lVar10];
  }
  coords = (GLfloat (*) [2])malloc(0x2008);
  elements = (GLuint *)malloc(0x100c);
  pointset = bov_points_new((GLfloat (*) [2])0x0,0x401,0x88e4);
  order = bov_order_new((GLuint *)0x0,0x403,0x88e8);
  *coords = (GLfloat  [2])0xbdcccccdbf2b851e;
  coords[0x400] = (GLfloat  [2])0xbdcccccd3f2b851e;
  for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 4) {
    *(undefined4 *)((long)(pointset->param).fillColor + lVar10) =
         *(undefined4 *)((long)&DAT_0011b080 + lVar10);
  }
  for (lVar10 = 8; lVar10 != 0xc; lVar10 = lVar10 + 1) {
    (pointset->param).fillColor[lVar10 + -4] = 1.0;
  }
  local_94 = 0.33;
  uVar11 = 1;
  for (iVar9 = 0; iVar9 != 4; iVar9 = iVar9 + 1) {
    uVar1 = uVar11 * 4;
    in_RCX = (GLfloat (*) [2])0x0;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar1;
    *elements = 0;
    for (uVar12 = 0; (uVar11 << 4 | 4) != uVar12; uVar12 = uVar12 + 4) {
      *(int *)((long)elements + uVar12 + 4) = (int)in_RCX;
      in_RCX = (GLfloat (*) [2])
               (ulong)(uint)((int)in_RCX + SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x400)) / auVar7,0))
      ;
    }
    elements[uVar11 * 4 + 2] = 0x400;
    bov_order_update(order,elements,(uint)uVar1 | 3);
    dVar3 = window->wtime;
    dVar13 = dVar3;
    while (dVar13 = dVar13 - dVar3, dVar13 < 1.3) {
      s = (float)(dVar13 / 1.3);
      for (uVar12 = 0; uVar12 != uVar11; uVar12 = uVar12 + 1) {
        uVar4 = elements[uVar12 * 4 + 1];
        uVar5 = elements[uVar12 * 4 + 2];
        in_RCX = coords + elements[uVar12 * 4 + 3];
        uVar6 = elements[uVar12 * 4 + 4];
        fVar14 = SUB84(coords[elements[uVar12 * 4 + 5]],0) - SUB84(coords[uVar4],0);
        fVar16 = SUB84(coords[elements[uVar12 * 4 + 5]],4) - SUB84(coords[uVar4],4);
        local_70 = CONCAT44(fVar16,fVar14);
        for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
          fVar2 = *(float *)((long)&local_70 + lVar10 * 4);
          coords[uVar5][lVar10] =
               (1.0 - s) * 0.25 * fVar2 + (s / 3.0) * fVar2 + coords[uVar4][lVar10];
          (*in_RCX)[lVar10] = fVar2 * 0.5 + coords[uVar4][lVar10];
          coords[uVar6][lVar10] =
               fVar2 * (1.0 - s) * 0.75 + ((s + s) / 3.0) * fVar2 + coords[uVar4][lVar10];
        }
        aGVar15[1] = SUB84(*in_RCX,4) + fVar14 * s * 0.28867513;
        aGVar15[0] = SUB84(*in_RCX,0) + fVar16 * -(s * 0.28867513);
        *in_RCX = aGVar15;
        in_R8 = 2;
      }
      bov_points_update(pointset,coords,0x401);
      parameters_update(pointset,local_94,s);
      bov_curve_draw_with_order(window,pointset,order,(GLint)in_RCX,(GLsizei)in_R8);
      bov_window_update(window);
      dVar13 = window->wtime;
      iVar8 = bov_window_should_close(window);
      if (iVar8 != 0) goto LAB_001059a6;
    }
    local_94 = local_94 * 0.33333334;
    uVar11 = uVar1;
  }
  builtin_memcpy(local_58 + 0x10,"evel reached",0xd);
  builtin_memcpy(local_58,"Max. iteration l",0x10);
  text = bov_text_new(local_58,0x88e4);
  (text->param).fillColor[0] = 0.0;
  (text->param).fillColor[1] = 0.0;
  (text->param).fillColor[2] = 0.0;
  (text->param).fillColor[3] = 0.0;
  (text->param).outlineColor[0] = 1.0;
  (text->param).outlineColor[1] = 1.0;
  (text->param).outlineColor[2] = 1.0;
  (text->param).outlineColor[3] = 1.0;
  (text->param).pos[0] = 64.0;
  (text->param).pos[1] = 64.0;
  (text->param).shift[0] = 0.0;
  (text->param).shift[1] = 0.0;
  (text->param).fontSize = 64.0;
  (text->param).boldness = 0.3;
  (text->param).outlineWidth = 1.0;
  (text->param).spaceType = PIXEL_SPACE;
  parameters_update(pointset,local_94,0.0);
  bov_points_update(pointset,coords,0x401);
  while (iVar9 = bov_window_should_close(window), iVar9 == 0) {
    bov_curve_draw_with_order(window,pointset,order,(GLint)in_RCX,(GLsizei)in_R8);
    bov_text_draw(window,text);
    bov_window_update_and_wait_events(window);
  }
  bov_text_delete(text);
LAB_001059a6:
  bov_order_delete(order);
  free(elements);
  bov_points_delete(pointset);
  free(coords);
  bov_window_delete(window);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
	bov_window_t* window = bov_window_new(1024, 640, argv[0]);
	bov_window_set_color(window, (GLfloat[4]) {0.3, 0.3, 0.3, 1.0});

	const int maxIters = 5;
	const size_t maxSegment = 1ULL << (2 * maxIters); // 4^maxIter with bits operations
	const size_t maxPoints = maxSegment + 1;

	// allocations
	GLfloat (*coords)[2] = malloc(2 * sizeof(GLfloat) * maxPoints);
	GLuint* indices = malloc(sizeof(GLuint) * (maxPoints + 2));
	bov_points_t* pointset = bov_points_new(NULL, maxPoints, GL_STATIC_DRAW); // GPU mirror of coords
	bov_order_t* order = bov_order_new(NULL, maxPoints + 2, GL_DYNAMIC_DRAW); // GPU mirror of indices

	// initialization
	size_t nSegment = 1;                // nPoints = nSegment+1
	GLfloat segWidth = ORIGINAL_SEGWIDTH; // the width of each segments

	coords[0][0] = -1.0 + segWidth;
	coords[0][1] = -0.1;
	coords[maxSegment][0] = 1.0 - segWidth;
	coords[maxSegment][1] = -0.1;

	// we set those parameters once and for all, other parameters
	// will be updated during the animation
	GLfloat fillColor[4] = {1, 1, 1, 1};
	GLfloat outColor[4] = {0.7, 0.5, 0.0, 2.0};
	bov_points_set_color(pointset, outColor);
	bov_points_set_outline_color(pointset, fillColor);

	// iterations
	for(int i=0; i<maxIters-1; i++) {
		indices_update(indices, 4 * nSegment, maxSegment);
		bov_order_update(order, indices, 4 * nSegment + 3);

		// animation (here we recompute the points each times)
		double tbegin = bov_window_get_time(window);
		double tnow = tbegin;
		while(tnow - tbegin < TRANSITION_TIME) {
			// interpolation factor
			GLfloat s = (tnow - tbegin)/TRANSITION_TIME;

			coords_update(coords, indices, nSegment, s);
			bov_points_update(pointset, coords, maxPoints);
			parameters_update(pointset, segWidth, s);

			bov_curve_draw_with_order(window, pointset, order, 0, BOV_TILL_END);
			bov_window_update(window);

			tnow = bov_window_get_time(window);

			if(bov_window_should_close(window))
				goto end_of_program;
		}

		nSegment *= 4;
		segWidth *= 1.0 / 3.0;
	}

	bov_text_t* end = bov_text_new((GLubyte[]){"Max. iteration level reached"}, GL_STATIC_DRAW);
	bov_text_set_param(end, (bov_text_param_t) {
	  .spaceType = PIXEL_SPACE,
	  .fontSize = 64,
	  .pos = {64, 64},
	  .fillColor = {0},          // transparent
	  .outlineColor = {1, 1, 1, 1}, // white
	  .boldness = 0.3,
	  .outlineWidth = 1.0
	});

	parameters_update(pointset, segWidth, 0);
	bov_points_update(pointset, coords, maxPoints);

	while(!bov_window_should_close(window)) {
		bov_curve_draw_with_order(window, pointset, order, 0, BOV_TILL_END);
		bov_text_draw(window, end);
		bov_window_update_and_wait_events(window);
	}

	bov_text_delete(end);

end_of_program:

	bov_order_delete(order);
	free(indices);
	bov_points_delete(pointset);
	free(coords);
	bov_window_delete(window);

	return EXIT_SUCCESS;
}